

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

void __thiscall
pybind11::arg_v::
arg_v<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
          (arg_v *this,arg *base,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *x,char *descr)

{
  undefined8 uVar1;
  handle hVar2;
  long lVar3;
  
  uVar1 = *(undefined8 *)&base->field_0x8;
  (this->super_arg).name = base->name;
  *(undefined8 *)&(this->super_arg).field_0x8 = uVar1;
  hVar2 = detail::
          set_caster<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>,unsigned_int>
          ::
          cast<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>&>
                    (x,automatic,(handle)0x0);
  (this->value).super_handle.m_ptr = hVar2.m_ptr;
  this->descr = descr;
  lVar3 = PyErr_Occurred();
  if (lVar3 != 0) {
    PyErr_Clear();
  }
  return;
}

Assistant:

arg_v(arg &&base, T &&x, const char *descr = nullptr)
        : arg(base),
          value(reinterpret_steal<object>(
              detail::make_caster<T>::cast(x, return_value_policy::automatic, {})
          )),
          descr(descr)
#if !defined(NDEBUG)
        , type(type_id<T>())
#endif
    {
        // Workaround! See:
        // https://github.com/pybind/pybind11/issues/2336
        // https://github.com/pybind/pybind11/pull/2685#issuecomment-731286700
        if (PyErr_Occurred()) {
            PyErr_Clear();
        }
    }